

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

void AddTail<stTimeoutItem_t,stTimeoutItemLink_t>(stTimeoutItemLink_t *apLink,stTimeoutItem_t *ap)

{
  stTimeoutItem_t *ap_local;
  stTimeoutItemLink_t *apLink_local;
  
  if (ap->pLink == (stTimeoutItemLink_t *)0x0) {
    if (apLink->tail == (stTimeoutItem_t *)0x0) {
      apLink->tail = ap;
      apLink->head = ap;
      ap->pPrev = (stTimeoutItem_t *)0x0;
      ap->pNext = (stTimeoutItem_t *)0x0;
    }
    else {
      apLink->tail->pNext = ap;
      ap->pNext = (stTimeoutItem_t *)0x0;
      ap->pPrev = apLink->tail;
      apLink->tail = ap;
    }
    ap->pLink = apLink;
  }
  return;
}

Assistant:

void inline AddTail(TLink*apLink,TNode *ap)
{
	if( ap->pLink )
	{
		return ;
	}
	if(apLink->tail)
	{
		apLink->tail->pNext = (TNode*)ap;
		ap->pNext = NULL;
		ap->pPrev = apLink->tail;
		apLink->tail = ap;
	}
	else
	{
		apLink->head = apLink->tail = ap;
		ap->pNext = ap->pPrev = NULL;
	}
	ap->pLink = apLink;
}